

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O2

size_t __thiscall CTxMemPool::DynamicMemoryUsage(CTxMemPool *this)

{
  pointer psVar1;
  pointer psVar2;
  size_type sVar3;
  size_t sVar4;
  size_t sVar5;
  uint64_t uVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock15;
  unique_lock<std::recursive_mutex> uStack_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&uStack_38,&this->cs,"cs",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/txmempool.cpp"
             ,0x405,false);
  psVar1 = (this->txns_randomized).
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  psVar2 = (this->txns_randomized).
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar7 = 0;
  if (psVar1 != psVar2) {
    uVar7 = (long)psVar1 + (0x1f - (long)psVar2) & 0xfffffffffffffff0;
  }
  sVar3 = (this->mapTx).node_count;
  sVar4 = (this->mapNextTx).m._M_t._M_impl.super__Rb_tree_header._M_node_count;
  sVar5 = (this->mapDeltas)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  uVar6 = this->cachedInnerUsage;
  std::unique_lock<std::recursive_mutex>::~unique_lock(&uStack_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return sVar5 * 0x60 + sVar4 * 0x40 + sVar3 * 0x1a0 + uVar6 + uVar7;
  }
  __stack_chk_fail();
}

Assistant:

size_t CTxMemPool::DynamicMemoryUsage() const {
    LOCK(cs);
    // Estimate the overhead of mapTx to be 15 pointers + an allocation, as no exact formula for boost::multi_index_contained is implemented.
    return memusage::MallocUsage(sizeof(CTxMemPoolEntry) + 15 * sizeof(void*)) * mapTx.size() + memusage::DynamicUsage(mapNextTx) + memusage::DynamicUsage(mapDeltas) + memusage::DynamicUsage(txns_randomized) + cachedInnerUsage;
}